

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O1

bool __thiscall protozero::pbf_reader::get_bool(pbf_reader *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  assert_error *this_00;
  undefined8 *puVar4;
  char *pcVar5;
  pointer_____offset_0x10___ *ppuVar6;
  char *pcVar7;
  bool bVar8;
  
  if (this->m_tag == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"tag() != 0 && \"call next() before accessing field value\"")
    ;
  }
  else {
    if (this->m_wire_type == varint) {
      pcVar2 = this->m_data;
      pcVar3 = this->m_end;
      bVar8 = pcVar2 == pcVar3;
      pcVar5 = pcVar2;
      if (!bVar8) {
        pcVar7 = pcVar2;
        if (*pcVar2 < '\0') {
          do {
            pcVar7 = pcVar7 + 1;
            bVar8 = pcVar7 == pcVar3;
            pcVar5 = pcVar3;
            if (bVar8) break;
            pcVar5 = pcVar7;
          } while (*pcVar7 < '\0');
        }
        else {
          bVar8 = false;
        }
      }
      if ((long)pcVar5 - (long)pcVar2 < 10) {
        if (!bVar8) {
          cVar1 = *pcVar2;
          this->m_data = pcVar5 + 1;
          return cVar1 != '\0';
        }
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PTR__exception_002581d0;
        ppuVar6 = &end_of_buffer_exception::typeinfo;
      }
      else {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PTR__exception_002581a8;
        ppuVar6 = &varint_too_long_exception::typeinfo;
      }
      __cxa_throw(puVar4,ppuVar6,std::exception::~exception);
    }
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"has_wire_type(pbf_wire_type::varint) && \"not a varint\"");
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool get_bool() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        protozero_assert(has_wire_type(pbf_wire_type::varint) && "not a varint");
        const bool result = m_data[0] != 0;
        skip_varint(&m_data, m_end);
        return result;
    }